

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O0

uint64_t bloaty::anon_unknown_0::ToVMAddr(uint64_t addr,uint64_t ndx,bool is_object)

{
  byte in_DL;
  ulong in_RSI;
  char *in_RDI;
  int line;
  char *local_8;
  
  local_8 = in_RDI;
  if ((in_DL & 1) != 0) {
    line = (int)(in_RSI >> 0x20);
    if (0xffffff < in_RSI) {
      Throw(in_RDI,line);
    }
    if ((char *)0xffffffffff < in_RDI) {
      Throw(in_RDI,line);
    }
    local_8 = (char *)(in_RSI << 0x28 | (ulong)in_RDI);
  }
  return (uint64_t)local_8;
}

Assistant:

static uint64_t ToVMAddr(uint64_t addr, uint64_t ndx, bool is_object) {
  if (is_object) {
    if (ndx >= 1 << 24) {
      THROW("ndx overflow: too many sections");
    }
    if (addr >= ((uint64_t)1) << 40) {
      THROW("address overflow: section too big");
    }
    return (ndx << 40) | addr;
  } else {
    return addr;
  }
}